

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeGetQuadErrWeights(void *cvode_mem,N_Vector eQweight)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x797;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x5c) != 0) {
      if (*(int *)((long)cvode_mem + 0x68) == 0) {
        return 0;
      }
      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)cvode_mem + 0x268));
      return 0;
    }
    msgfmt = "Quadrature integration not activated.";
    error_code = -0x1e;
    line = 0x79f;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetQuadErrWeights",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeGetQuadErrWeights(void* cvode_mem, N_Vector eQweight)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_quadr == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    return (CV_NO_QUAD);
  }

  if (cv_mem->cv_errconQ) { N_VScale(ONE, cv_mem->cv_ewtQ, eQweight); }

  return (CV_SUCCESS);
}